

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_dump.c
# Opt level: O0

void init_dump_state(dstate state)

{
  dstate state_local;
  
  state->output_len = 0;
  state->output_limit = -1;
  state->use_XML = 0;
  state->addr_list_cnt = 0;
  state->indent = 0;
  state->use_file_out = 1;
  state->offset_base = (char *)0x0;
  state->output_string = (char *)0x0;
  state->realloc_string = 0;
  state->out = _stdout;
  return;
}

Assistant:

void
init_dump_state(dstate state)
{
    state->output_len = 0;
    state->output_limit = -1;
    state->use_XML = 0;
    state->addr_list_cnt = 0;
    state->indent = 0;
    state->use_file_out = 1;
    state->offset_base = NULL;
    state->output_string = NULL;
    state->realloc_string = 0;
    state->out = stdout;
}